

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall helics::FederateState::finalize(FederateState *this)

{
  MessageTimer *this_00;
  long lVar1;
  MessageProcessingResult MVar2;
  int32_t iVar3;
  ActionMessage *this_01;
  ActionMessage grantCheck;
  ActionMessage local_250;
  ActionMessage local_198;
  ActionMessage local_e0;
  
  if (((this->state)._M_i != FINISHED) && ((this->state)._M_i != ERRORED)) {
    if (0 < (this->grantTimeOutPeriod).internalTimeCode) {
      ActionMessage::ActionMessage(&local_250,cmd_grant_timeout_check);
      local_250.dest_handle.hid = this->mGrantCount;
      local_250.counter = 0;
      local_250.actionTime.internalTimeCode = 0x7fffffffffffffff;
      this_00 = (this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if (this->grantTimeoutTimeIndex < 0) {
        lVar1 = (this->grantTimeOutPeriod).internalTimeCode;
        ActionMessage::ActionMessage(&local_e0,&local_250);
        iVar3 = MessageTimer::addTimerFromNow
                          (this_00,(nanoseconds)(lVar1 - lVar1 % 1000000),&local_e0);
        this->grantTimeoutTimeIndex = iVar3;
        this_01 = &local_e0;
      }
      else {
        iVar3 = this->realTimeTimerIndex;
        lVar1 = (this->grantTimeOutPeriod).internalTimeCode;
        this_01 = &local_198;
        ActionMessage::ActionMessage(this_01,&local_250);
        MessageTimer::updateTimerFromNow
                  (this_00,iVar3,(nanoseconds)(lVar1 - lVar1 % 1000000),this_01);
      }
      ActionMessage::~ActionMessage(this_01);
      ActionMessage::~ActionMessage(&local_250);
    }
    do {
      MVar2 = genericUnspecifiedQueueProcess(this,false);
    } while ((MessageProcessingResult)(MVar2 & 0xfb) != HALTED);
    this->mGrantCount = this->mGrantCount + 1;
    if (0 < (this->grantTimeOutPeriod).internalTimeCode) {
      MessageTimer::cancelTimer
                ((this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,this->grantTimeoutTimeIndex);
    }
  }
  return;
}

Assistant:

uint64_t FederateState::getQueueSize() const
{
    uint64_t cnt = 0;
    for (const auto& end_point : interfaceInformation.getEndpoints()) {
        cnt += end_point->availableMessages();
    }
    return cnt;
}